

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O0

int test_contexts_mac(char *name)

{
  int iVar1;
  char *in_RDI;
  int i;
  size_t tmplen;
  size_t outlen;
  uchar c [64];
  uchar b [64];
  uchar pt [256];
  EVP_MAC_CTX *ctx;
  EVP_MAC *mac;
  EVP_MD *type;
  uchar K [32];
  int test;
  int ret;
  bool local_1ed;
  int local_1ec;
  undefined1 local_1e8 [8];
  ulong local_1e0;
  size_t in_stack_fffffffffffffe28;
  void *in_stack_fffffffffffffe30;
  undefined1 local_198 [64];
  undefined1 local_158 [264];
  long local_50;
  long local_48;
  EVP_MD *local_40;
  undefined8 local_38;
  undefined8 local_30;
  EVP_MD *type_00;
  uint local_4;
  
  local_38 = 1;
  local_30 = 0;
  iVar1 = 0;
  type_00 = (EVP_MD *)0x0;
  local_40 = EVP_get_digestbyname(in_RDI);
  if (local_40 == (EVP_MD *)0x0) {
    local_48 = EVP_MAC_fetch(0,in_RDI);
    if (local_48 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("mac = EVP_MAC_fetch(NULL, name, NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x105);
    }
    printf("\x1b[1;34mMac test for %s\x1b[m\n");
    memset(local_158,0,0x100);
    local_158[0] = 1;
    memset(local_198,0,0x40);
    memset(&stack0xfffffffffffffe28,0,0x40);
    local_50 = EVP_MAC_CTX_new(local_48);
    if (local_50 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x110);
    }
    iVar1 = EVP_MAC_init(local_50,&local_38,0x20,0);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MAC_init(ctx, K, sizeof(K), NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x111);
    }
    iVar1 = EVP_MAC_update(local_50,local_158,0x100);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MAC_update(ctx, pt, sizeof(pt))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x112);
    }
    iVar1 = EVP_MAC_final(local_50,local_198,local_1e8,0x40);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MAC_final(ctx, b, &tmplen, sizeof(b))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x113);
    }
    EVP_MAC_CTX_free(local_50);
    printf(" cloned contexts: ");
    local_50 = EVP_MAC_CTX_new(local_48);
    if (local_50 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x118);
    }
    iVar1 = EVP_MAC_init(local_50,&local_38,0x20,0);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MAC_init(ctx, K, sizeof(K), NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x119);
    }
    for (local_1ec = 0; local_1ec < 0x10; local_1ec = local_1ec + 1) {
      iVar1 = EVP_MAC_update(local_50,local_158 + (local_1ec << 4),0x10);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EVP_MAC_update(ctx, pt + STEP_SIZE * i, STEP_SIZE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                    ,0x11c);
      }
    }
    local_1e0 = (ulong)(local_1ec << 4);
    iVar1 = EVP_MAC_final(local_50,&stack0xfffffffffffffe28,local_1e8,0x40);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MAC_final(ctx, c, &tmplen, sizeof(c))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0x11f);
    }
    EVP_MAC_CTX_free(local_50);
    EVP_MAC_free(local_48);
    local_1ed = true;
    if (local_1e0 == 0x100) {
      iVar1 = memcmp(&stack0xfffffffffffffe28,local_198,0x40);
      local_1ed = iVar1 != 0;
    }
    local_4 = (uint)local_1ed;
    if (local_1ed == false) {
      printf("\x1b[1;32m  Test passed\x1b[m\n");
    }
    else {
      printf("\x1b[1;31m  Test FAILED\x1b[m\n");
    }
    if (local_4 != 0) {
      printf("  b[%d] = ",local_1e0 & 0xffffffff);
      hexdump(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      printf("  c[%d] = ",local_1e0 & 0xffffffff);
      hexdump(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
  }
  else {
    printf("\x1b[1;34mMac via EVP_MD test for %s\x1b[m\n",in_RDI);
    local_4 = test_contexts_digest_or_legacy_mac(type_00,iVar1);
  }
  return local_4;
}

Assistant:

static int test_contexts_mac(const char *name)
{
    int ret = 0, test = 0;
    unsigned char K[32] = {1};
    const EVP_MD *type = EVP_get_digestbyname(name);
    EVP_MAC *mac;

    if (type) {
        printf(cBLUE "Mac via EVP_MD test for %s" cNORM "\n", name);
        return test_contexts_digest_or_legacy_mac(type, 1);
    }

    T(mac = EVP_MAC_fetch(NULL, name, NULL));
    printf(cBLUE "Mac test for %s" cNORM "\n", name);

    /* produce base mac */
    EVP_MAC_CTX *ctx;
    unsigned char pt[TEST_SIZE] = {1};
    unsigned char b[EVP_MAX_MD_SIZE] = {0};
    unsigned char c[EVP_MAX_MD_SIZE] = {0};
    size_t outlen, tmplen;

    /* Simply mac whole input. */
    T(ctx = EVP_MAC_CTX_new(mac));
    T(EVP_MAC_init(ctx, K, sizeof(K), NULL));
    T(EVP_MAC_update(ctx, pt, sizeof(pt)));
    T(EVP_MAC_final(ctx, b, &tmplen, sizeof(b)));
    EVP_MAC_CTX_free(ctx);

    /* Mac with rolling input. */
    printf(" cloned contexts: ");
    T(ctx = EVP_MAC_CTX_new(mac));
    T(EVP_MAC_init(ctx, K, sizeof(K), NULL));
    int i;
    for (i = 0; i < TEST_SIZE / STEP_SIZE; i++) {
	T(EVP_MAC_update(ctx, pt + STEP_SIZE * i, STEP_SIZE));
    }
    outlen = i * STEP_SIZE;
    T(EVP_MAC_final(ctx, c, &tmplen, sizeof(c)));
    EVP_MAC_CTX_free(ctx);
    EVP_MAC_free(mac);

    /* Rolling mac should give the same result as the simple mac. */
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, EVP_MAX_MD_SIZE));

    if (test) {
        printf("  b[%d] = ", (int)outlen);
	hexdump(b, outlen);
        printf("  c[%d] = ", (int)outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    return ret;
}